

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_IntPrecision_Test::TestBody(PrintfTest_IntPrecision_Test *this)

{
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string_view format_23;
  string_view format_24;
  string_view format_25;
  string_view format_26;
  string_view format_27;
  string_view format_28;
  string_view format_29;
  string_view format_30;
  AssertionResult gtest_ar_1;
  string local_50;
  AssertionResult gtest_ar;
  undefined4 local_c;
  
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format.size_ = 4;
  format.data_ = "%.5d";
  test_sprintf<int>(&local_50,format,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a359;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042\"","test_sprintf(\"%.5d\", 42)",(char (*) [6])0x19a359,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%.5d");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xe7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_00.size_ = 4;
  format_00.data_ = "%.5d";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_00);
  local_c = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042\"","fmt::sprintf(make_positional(\"%.5d\"), 42)",
             (char (*) [6])0x19a359,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0xffffff;
  format_01.size_ = 4;
  format_01.data_ = "%.5d";
  test_sprintf<int>(&local_50,format_01,(int *)&gtest_ar_1);
  pcVar2 = "-00042";
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-00042\"","test_sprintf(\"%.5d\", -42)",(char (*) [7])"-00042"
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%.5d");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xe8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_02.size_ = 4;
  format_02.data_ = "%.5d";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_02);
  local_c = 0xffffffd6;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"-00042\"","fmt::sprintf(make_positional(\"%.5d\"), -42)",
             (char (*) [7])"-00042",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_03.size_ = 4;
  format_03.data_ = "%.5x";
  test_sprintf<int>(&local_50,format_03,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a359;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042\"","test_sprintf(\"%.5x\", 0x42)",(char (*) [6])0x19a359
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xe9;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_04.size_ = 4;
  format_04.data_ = "%.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_04);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042\"","fmt::sprintf(make_positional(\"%.5x\"), 0x42)",
             (char (*) [6])0x19a359,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_05.size_ = 5;
  format_05.data_ = "%#.5x";
  test_sprintf<int>(&local_50,format_05,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a29e;
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x00042\"","test_sprintf(\"%#.5x\", 0x42)",
             (char (*) [8])0x19a29e,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%#.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xea;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_06.size_ = 5;
  format_06.data_ = "%#.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_06);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"0x00042\"","fmt::sprintf(make_positional(\"%#.5x\"), 0x42)",
             (char (*) [8])0x19a29e,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_07.size_ = 4;
  format_07.data_ = "%.5o";
  test_sprintf<int>(&local_50,format_07,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a359;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042\"","test_sprintf(\"%.5o\", 042)",(char (*) [6])0x19a359,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xeb;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_08.size_ = 4;
  format_08.data_ = "%.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_08);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042\"","fmt::sprintf(make_positional(\"%.5o\"), 042)",
             (char (*) [6])0x19a359,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_09.size_ = 5;
  format_09.data_ = "%#.5o";
  test_sprintf<int>(&local_50,format_09,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a359;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042\"","test_sprintf(\"%#.5o\", 042)",(char (*) [6])0x19a359
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%#.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xec;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_10.size_ = 5;
  format_10.data_ = "%#.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_10);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042\"","fmt::sprintf(make_positional(\"%#.5o\"), 042)",
             (char (*) [6])0x19a359,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_11.size_ = 5;
  format_11.data_ = "%7.5d";
  test_sprintf<int>(&local_50,format_11,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a357;
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"  00042\"","test_sprintf(\"%7.5d\", 42)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%7.5d");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xee;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_12.size_ = 5;
  format_12.data_ = "%7.5d";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_12);
  local_c = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5d\"), 42)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_13.size_ = 5;
  format_13.data_ = "%7.5x";
  test_sprintf<int>(&local_50,format_13,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a357;
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"  00042\"","test_sprintf(\"%7.5x\", 0x42)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%7.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xef;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_14.size_ = 5;
  format_14.data_ = "%7.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_14);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5x\"), 0x42)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_15.size_ = 7;
  format_15.data_ = "%#10.5x";
  test_sprintf<int>(&local_50,format_15,(int *)&gtest_ar_1);
  pcVar2 = "   0x00042";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"   0x00042\"","test_sprintf(\"%#10.5x\", 0x42)",
             (char (*) [11])"   0x00042",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%#10.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_16.size_ = 7;
  format_16.data_ = "%#10.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_16);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"   0x00042\"",
             "fmt::sprintf(make_positional(\"%#10.5x\"), 0x42)",(char (*) [11])"   0x00042",
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_17.size_ = 5;
  format_17.data_ = "%7.5o";
  test_sprintf<int>(&local_50,format_17,(int *)&gtest_ar_1);
  piVar1 = (int *)0x19a357;
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"  00042\"","test_sprintf(\"%7.5o\", 042)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%7.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0xf1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_18.size_ = 5;
  format_18.data_ = "%7.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_18);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,piVar1);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"  00042\"","fmt::sprintf(make_positional(\"%7.5o\"), 042)",
             (char (*) [8])0x19a357,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_19.size_ = 7;
  format_19.data_ = "%#10.5o";
  test_sprintf<int>(&local_50,format_19,(int *)&gtest_ar_1);
  pcVar2 = "     00042";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"     00042\"","test_sprintf(\"%#10.5o\", 042)",
             (char (*) [11])"     00042",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%#10.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_20.size_ = 7;
  format_20.data_ = "%#10.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_20);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"     00042\"",
             "fmt::sprintf(make_positional(\"%#10.5o\"), 042)",(char (*) [11])"     00042",&local_50
            );
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_21.size_ = 6;
  format_21.data_ = "%-7.5d";
  test_sprintf<int>(&local_50,format_21,(int *)&gtest_ar_1);
  pcVar2 = "00042  ";
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042  \"","test_sprintf(\"%-7.5d\", 42)",
             (char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%-7.5d");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_22.size_ = 6;
  format_22.data_ = "%-7.5d";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_22);
  local_c = 0x2a;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5d\"), 42)",
             (char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_23.size_ = 6;
  format_23.data_ = "%-7.5x";
  test_sprintf<int>(&local_50,format_23,(int *)&gtest_ar_1);
  pcVar2 = "00042  ";
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042  \"","test_sprintf(\"%-7.5x\", 0x42)",
             (char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%-7.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf5;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_24.size_ = 6;
  format_24.data_ = "%-7.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_24);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5x\"), 0x42)"
             ,(char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_25.size_ = 8;
  format_25.data_ = "%-#10.5x";
  test_sprintf<int>(&local_50,format_25,(int *)&gtest_ar_1);
  pcVar2 = "0x00042   ";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x00042   \"","test_sprintf(\"%-#10.5x\", 0x42)",
             (char (*) [11])"0x00042   ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%-#10.5x");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_26.size_ = 8;
  format_26.data_ = "%-#10.5x";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_26);
  local_c = 0x42;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"0x00042   \"",
             "fmt::sprintf(make_positional(\"%-#10.5x\"), 0x42)",(char (*) [11])"0x00042   ",
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_27.size_ = 6;
  format_27.data_ = "%-7.5o";
  test_sprintf<int>(&local_50,format_27,(int *)&gtest_ar_1);
  pcVar2 = "00042  ";
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042  \"","test_sprintf(\"%-7.5o\", 042)",
             (char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%-7.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_28.size_ = 6;
  format_28.data_ = "%-7.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_28);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042  \"","fmt::sprintf(make_positional(\"%-7.5o\"), 042)",
             (char (*) [8])"00042  ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  format_29.size_ = 8;
  format_29.data_ = "%-#10.5o";
  test_sprintf<int>(&local_50,format_29,(int *)&gtest_ar_1);
  pcVar2 = "00042     ";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"00042     \"","test_sprintf(\"%-#10.5o\", 042)",
             (char (*) [11])"00042     ",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"format: ");
    std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"%-#10.5o");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0xf8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_30.size_ = 8;
  format_30.data_ = "%-#10.5o";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_30);
  local_c = 0x22;
  fmt::v5::sprintf<std::__cxx11::string,int>
            (&local_50,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"00042     \"",
             "fmt::sprintf(make_positional(\"%-#10.5o\"), 042)",(char (*) [11])"00042     ",
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(PrintfTest, IntPrecision) {
  EXPECT_PRINTF("00042", "%.5d", 42);
  EXPECT_PRINTF("-00042", "%.5d", -42);
  EXPECT_PRINTF("00042", "%.5x", 0x42);
  EXPECT_PRINTF("0x00042", "%#.5x", 0x42);
  EXPECT_PRINTF("00042", "%.5o", 042);
  EXPECT_PRINTF("00042", "%#.5o", 042);

  EXPECT_PRINTF("  00042", "%7.5d", 42);
  EXPECT_PRINTF("  00042", "%7.5x", 0x42);
  EXPECT_PRINTF("   0x00042", "%#10.5x", 0x42);
  EXPECT_PRINTF("  00042", "%7.5o", 042);
  EXPECT_PRINTF("     00042", "%#10.5o", 042);

  EXPECT_PRINTF("00042  ", "%-7.5d", 42);
  EXPECT_PRINTF("00042  ", "%-7.5x", 0x42);
  EXPECT_PRINTF("0x00042   ", "%-#10.5x", 0x42);
  EXPECT_PRINTF("00042  ", "%-7.5o", 042);
  EXPECT_PRINTF("00042     ", "%-#10.5o", 042);
}